

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  Extension *pEVar1;
  pointer piVar2;
  string_view str;
  LogMessage local_20;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x226,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_20,str);
    goto LAB_003fc814;
  }
  if (pEVar1->is_repeated == false) {
    SetRepeatedEnum((ExtensionSet *)&local_20);
LAB_003fc800:
    SetRepeatedEnum((ExtensionSet *)&local_20);
  }
  else {
    if ((byte)(pEVar1->type - 0x13) < 0xee) goto LAB_003fc800;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
      piVar2 = RepeatedField<int>::Mutable((RepeatedField<int> *)pEVar1->field_0,index);
      *piVar2 = value;
      return;
    }
  }
  SetRepeatedEnum();
LAB_003fc814:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  extension->ptr.repeated_enum_value->Set(index, value);
}